

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f)

{
  uint uVar1;
  Simd<unsigned_int,_(unsigned_char)__x04_> SVar2;
  byte local_49;
  undefined8 uStack_48;
  u8 i;
  SR result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> rhs;
  BinopFunc<unsigned_int,_unsigned_int> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  SVar2 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  result.v[2] = SVar2.v[0];
  result.v[3] = SVar2.v[1];
  lhs.v[0] = SVar2.v[2];
  lhs.v[1] = SVar2.v[3];
  for (local_49 = 0; local_49 < 4; local_49 = local_49 + 1) {
    uVar1 = (*f)(result.v[(ulong)local_49 + 2],lhs.v[(ulong)local_49 + 2]);
    lhs.v[(ulong)local_49 - 6] = uVar1;
  }
  SVar2.v[2] = result.v[0];
  SVar2.v[3] = result.v[1];
  SVar2.v._0_8_ = uStack_48;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,SVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}